

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O2

void __thiscall Fl_RGB_Image::~Fl_RGB_Image(Fl_RGB_Image *this)

{
  ~Fl_RGB_Image(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

Fl_RGB_Image::~Fl_RGB_Image() {
#ifdef __APPLE__
  if (id_) CGImageRelease((CGImageRef)id_);
  else if (alloc_array) delete[] (uchar *)array;
#else
  uncache();
  if (alloc_array) delete[] (uchar *)array;
#endif
}